

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::SpillPointers::create(SpillPointers *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x378);
  memset(__s,0,0x378);
  *__s = (_func_int *)&PTR__Pass_010909c0;
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  *(undefined1 *)(__s + 10) = 0;
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x30) = 0;
  __s[0x31] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  __s[0x26] = (_func_int *)0x0;
  __s[0x27] = (_func_int *)0x0;
  __s[0x28] = (_func_int *)0x0;
  __s[0x29] = (_func_int *)0x0;
  __s[0x2a] = (_func_int *)0x0;
  __s[0x2b] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)(__s + 0x30);
  __s[0x33] = (_func_int *)(__s + 0x30);
  *(undefined4 *)(__s + 0x4c) = 0;
  __s[0x4d] = (_func_int *)0x0;
  memset(__s + 0x34,0,0xb2);
  __s[0x4e] = (_func_int *)(__s + 0x4c);
  __s[0x4f] = (_func_int *)(__s + 0x4c);
  __s[0x50] = (_func_int *)0x0;
  __s[0x52] = (_func_int *)(__s + 0x58);
  __s[0x53] = (_func_int *)0x1;
  __s[0x54] = (_func_int *)0x0;
  __s[0x55] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x56) = 0x3f800000;
  __s[0x57] = (_func_int *)0x0;
  __s[0x58] = (_func_int *)0x0;
  __s[0x59] = (_func_int *)0x0;
  __s[0x5a] = (_func_int *)0x0;
  __s[0x5b] = (_func_int *)0x0;
  __s[0x5c] = (_func_int *)(__s + 0x62);
  __s[0x5d] = (_func_int *)0x1;
  __s[0x5e] = (_func_int *)0x0;
  __s[0x5f] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x60) = 0x3f800000;
  __s[0x61] = (_func_int *)0x0;
  __s[0x62] = (_func_int *)0x0;
  *(undefined4 *)(__s + 99) = 0;
  __s[100] = (_func_int *)0x0;
  __s[0x65] = (_func_int *)0x0;
  __s[0x66] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__SpillPointers_010962b8;
  __s[0x67] = (_func_int *)(__s + 0x6d);
  __s[0x68] = (_func_int *)0x1;
  __s[0x69] = (_func_int *)0x0;
  __s[0x6a] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x6b) = 0x3f800000;
  __s[0x6c] = (_func_int *)0x0;
  __s[0x6d] = (_func_int *)0x0;
  __s[0x6e] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<SpillPointers>();
  }